

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void xmllintInit(xmllintState *lint)

{
  xmllintState *lint_local;
  
  memset(lint,0,0x360);
  lint->repeat = 1;
  lint->progresult = XMLLINT_RETURN_OK;
  lint->options = 0x410000;
  lint->htmlOptions = 0x410000;
  return;
}

Assistant:

static void
xmllintInit(xmllintState *lint) {
    memset(lint, 0, sizeof(*lint));

    lint->repeat = 1;
    lint->progresult = XMLLINT_RETURN_OK;
    lint->options = XML_PARSE_COMPACT | XML_PARSE_BIG_LINES;
#ifdef LIBXML_HTML_ENABLED
    lint->htmlOptions = HTML_PARSE_COMPACT | HTML_PARSE_BIG_LINES;
#endif
}